

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy>::do_regular
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this,
          int32_t qs,int32_t x,int32_t predicted,encoder_strategy *param_4)

{
  bool bVar1;
  unsigned_short uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int i;
  int32_t iVar5;
  int32_t iVar6;
  uint error_value_00;
  uint uVar7;
  reference this_00;
  void *extraout_RDX;
  void *__n;
  int32_t error_value;
  int32_t predicted_value;
  int32_t k;
  context_regular_mode *context;
  int32_t sign;
  encoder_strategy *param_4_local;
  int32_t predicted_local;
  int32_t x_local;
  int32_t qs_local;
  jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this_local;
  
  iVar3 = bit_wise_sign(qs);
  iVar4 = apply_sign(qs,iVar3);
  __n = (void *)(long)iVar4;
  this_00 = std::array<charls::context_regular_mode,_365UL>::operator[]
                      (&this->contexts_,(size_type)__n);
  iVar4 = context_regular_mode::get_golomb_coding_parameter(this_00);
  i = context_regular_mode::c(this_00,__n,extraout_RDX);
  iVar5 = apply_sign(i,iVar3);
  iVar5 = lossless_traits_impl<unsigned_short,_12>::correct_prediction(predicted + iVar5);
  iVar6 = apply_sign(x - iVar5,iVar3);
  error_value_00 = lossless_traits_impl<unsigned_short,_12>::compute_error_value(iVar6);
  uVar7 = context_regular_mode::get_error_correction(this_00,iVar4);
  iVar6 = map_error_value(uVar7 ^ error_value_00);
  encode_mapped_value(this,iVar4,iVar6,0x30);
  context_regular_mode::update_variables_and_bias(this_00,error_value_00,0,0x40);
  iVar4 = apply_sign(error_value_00,iVar3);
  uVar2 = lossless_traits_impl<unsigned_short,_12>::compute_reconstructed_sample(iVar5,iVar4);
  bVar1 = lossless_traits_impl<unsigned_short,_12>::is_near((uint)uVar2,x);
  if (!bVar1) {
    __assert_fail("traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x15c,
                  "sample_type charls::jls_codec<charls::lossless_traits<unsigned short, 12>, charls::encoder_strategy>::do_regular(const int32_t, const int32_t, const int32_t, encoder_strategy *) [Traits = charls::lossless_traits<unsigned short, 12>, Strategy = charls::encoder_strategy]"
                 );
  }
  iVar3 = apply_sign(error_value_00,iVar3);
  uVar2 = lossless_traits_impl<unsigned_short,_12>::compute_reconstructed_sample(iVar5,iVar3);
  return uVar2;
}

Assistant:

do_regular(const int32_t qs, const int32_t x, const int32_t predicted,
                                        encoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};
        const int32_t error_value{traits_.compute_error_value(apply_sign(x - predicted_value, sign))};

        encode_mapped_value(k, map_error_value(context.get_error_correction(k | traits_.near_lossless) ^ error_value),
                            traits_.limit);
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        ASSERT(traits_.is_near(traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)), x));
        return static_cast<sample_type>(
            traits_.compute_reconstructed_sample(predicted_value, apply_sign(error_value, sign)));
    }